

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O1

void __thiscall QRhiResourceUpdateBatch::~QRhiResourceUpdateBatch(QRhiResourceUpdateBatch *this)

{
  QRhiResourceUpdateBatchPrivate *pQVar1;
  undefined1 *puVar2;
  QRhiBufferData *this_00;
  long lVar3;
  
  pQVar1 = this->d;
  if (pQVar1 != (QRhiResourceUpdateBatchPrivate *)0x0) {
    std::_Destroy_n_aux<false>::__destroy_n<QRhiResourceUpdateBatchPrivate::TextureOp*,long_long>
              ((TextureOp *)
               (pQVar1->textureOps).super_QVLABase<QRhiResourceUpdateBatchPrivate::TextureOp>.
               super_QVLABaseBase.ptr,
               (pQVar1->textureOps).super_QVLABase<QRhiResourceUpdateBatchPrivate::TextureOp>.
               super_QVLABaseBase.s);
    puVar2 = (undefined1 *)
             (pQVar1->textureOps).super_QVLABase<QRhiResourceUpdateBatchPrivate::TextureOp>.
             super_QVLABaseBase.ptr;
    if ((QVLAStorage<2432UL,_8UL,_32LL> *)puVar2 !=
        &(pQVar1->textureOps).super_QVLAStorage<2432UL,_8UL,_32LL>) {
      QtPrivate::sizedFree
                (puVar2,(pQVar1->textureOps).
                        super_QVLABase<QRhiResourceUpdateBatchPrivate::TextureOp>.super_QVLABaseBase
                        .a * 0x980);
    }
    lVar3 = (pQVar1->bufferOps).super_QVLABase<QRhiResourceUpdateBatchPrivate::BufferOp>.
            super_QVLABaseBase.s;
    if (0 < lVar3) {
      lVar3 = lVar3 + 1;
      this_00 = (QRhiBufferData *)
                ((long)(pQVar1->bufferOps).super_QVLABase<QRhiResourceUpdateBatchPrivate::BufferOp>.
                       super_QVLABaseBase.ptr + 0x18);
      do {
        QRhiBufferData::~QRhiBufferData(this_00);
        lVar3 = lVar3 + -1;
        this_00 = this_00 + 6;
      } while (1 < lVar3);
    }
    puVar2 = (undefined1 *)
             (pQVar1->bufferOps).super_QVLABase<QRhiResourceUpdateBatchPrivate::BufferOp>.
             super_QVLABaseBase.ptr;
    if ((QVLAStorage<48UL,_8UL,_64LL> *)puVar2 !=
        &(pQVar1->bufferOps).super_QVLAStorage<48UL,_8UL,_64LL>) {
      QtPrivate::sizedFree
                (puVar2,(pQVar1->bufferOps).super_QVLABase<QRhiResourceUpdateBatchPrivate::BufferOp>
                        .super_QVLABaseBase.a * 0x30);
    }
    operator_delete(pQVar1,0x13c58);
    return;
  }
  return;
}

Assistant:

QRhiResourceUpdateBatch::~QRhiResourceUpdateBatch()
{
    delete d;
}